

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O1

unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
__thiscall
duckdb::CachingFileSystem::OpenFile(CachingFileSystem *this,OpenFileInfo *path,FileOpenFlags flags)

{
  CachedFile *cached_file_p;
  CachingFileHandle *this_00;
  undefined8 in_R8;
  FileOpenFlags flags_p;
  
  flags_p.flags = flags._8_8_;
  cached_file_p =
       ExternalFileCache::GetOrCreateCachedFile
                 ((ExternalFileCache *)(path->path)._M_string_length,(string *)flags.flags);
  this_00 = (CachingFileHandle *)operator_new(0x98);
  flags_p._8_8_ = in_R8;
  CachingFileHandle::CachingFileHandle
            (this_00,(CachingFileSystem *)path,(OpenFileInfo *)flags.flags,flags_p,cached_file_p);
  this->file_system = (FileSystem *)this_00;
  return (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>)
         (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>)
         this;
}

Assistant:

unique_ptr<CachingFileHandle> CachingFileSystem::OpenFile(const OpenFileInfo &path, FileOpenFlags flags) {
	return make_uniq<CachingFileHandle>(*this, path, flags, external_file_cache.GetOrCreateCachedFile(path.path));
}